

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_confidentialtx_context.cpp
# Opt level: O0

void __thiscall
ConfidentialTransactionContext_Constructor_Test::~ConfidentialTransactionContext_Constructor_Test
          (ConfidentialTransactionContext_Constructor_Test *this)

{
  void *in_RDI;
  
  ~ConfidentialTransactionContext_Constructor_Test
            ((ConfidentialTransactionContext_Constructor_Test *)0x22e7b8);
  operator_delete(in_RDI);
  return;
}

Assistant:

TEST(ConfidentialTransactionContext, Constructor)
{
  std::string exp_tx_str = "02000000000109c4149d4e59119f2b11b3e160b02694bc4ecbf56f6de4ab587128f86bf4e7d30000000000ffffffff0201f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f010000000005ee3fe00374eb131b54a7b528e5449b3827bcaa5069c259346810f20cf9079bd17b32fe481976a914d753351535a2a55f33ab39bbd6c70a55d46904e788ac01f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f01000000000007a120000000000000";
  ConfidentialTransactionContext empty_tx;
  ConfidentialTransactionContext str_tx(exp_tx_str);
  ConfidentialTransactionContext byte_tx(
      ByteData("02000000000109c4149d4e59119f2b11b3e160b02694bc4ecbf56f6de4ab587128f86bf4e7d30000000000ffffffff0201f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f010000000005ee3fe00374eb131b54a7b528e5449b3827bcaa5069c259346810f20cf9079bd17b32fe481976a914d753351535a2a55f33ab39bbd6c70a55d46904e788ac01f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f01000000000007a120000000000000"));
  ConfidentialTransactionContext copy_tx(str_tx);
  ConfidentialTransaction ctx(exp_tx_str);
  ConfidentialTransactionContext copy_tx2(ctx);
  ConfidentialTransactionContext copy_tx3;
  copy_tx3 = str_tx;

  EXPECT_STREQ(str_tx.GetHex().c_str(), byte_tx.GetHex().c_str());
  EXPECT_STREQ(str_tx.GetHex().c_str(), copy_tx.GetHex().c_str());
  EXPECT_STREQ(str_tx.GetHex().c_str(), copy_tx2.GetHex().c_str());
  EXPECT_STREQ(str_tx.GetHex().c_str(), copy_tx3.GetHex().c_str());
  EXPECT_STRNE(str_tx.GetHex().c_str(), empty_tx.GetHex().c_str());

  EXPECT_EQ(ConfidentialTransactionContext::GetLockTimeDisabledSequence(), 0xffffffffU);
}